

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<float,2ul>
          (AsciiParser *this,char sep,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *result)

{
  bool bVar1;
  allocator local_81;
  string local_80;
  array<float,_2UL> local_5c;
  array<float,_2UL> value_1;
  char c;
  array<float,_2UL> local_30;
  array<float,_2UL> value;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *result_local;
  char sep_local;
  AsciiParser *this_local;
  
  value._M_elems = (_Type)result;
  ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_30);
    if (bVar1) {
      ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::push_back
                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 value._M_elems,&local_30);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)value_1._M_elems + 2));
        if (!bVar1) {
          return false;
        }
        if (value_1._M_elems[0]._2_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_5c);
        if (!bVar1) break;
        ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::push_back
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   value._M_elems,&local_5c);
      }
      bVar1 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::empty
                        ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *
                         )value._M_elems);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_80,"Empty array.\n",&local_81);
        PushError(this,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(value_1._M_elems + 1),
                 "Not starting with the tuple value of requested type.\n",
                 (allocator *)((long)value_1._M_elems + 3));
      PushError(this,(string *)(value_1._M_elems + 1));
      ::std::__cxx11::string::~string((string *)(value_1._M_elems + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)value_1._M_elems + 3));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(const char sep,
                                  std::vector<std::array<T, N>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}